

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

char * __thiscall asmjit::v1_14::String::prepare(String *this,ModifyOp op,size_t size)

{
  ulong uVar1;
  String SVar2;
  ulong uVar3;
  void *__dest;
  String *pSVar4;
  char *__dest_00;
  ulong size_00;
  ulong uVar5;
  char *__s;
  size_t __n;
  ulong uVar6;
  String *__ptr;
  char *pcVar7;
  
  uVar5 = (ulong)op;
  SVar2 = *this;
  __n = (size_t)(byte)SVar2;
  if (__n < 0x1f) {
    __ptr = this + 1;
    uVar3 = 0x1e;
  }
  else {
    uVar3 = *(ulong *)(this + 0x10);
    __n = *(size_t *)(this + 8);
    __ptr = *(String **)(this + 0x18);
  }
  if (op == kAssign) {
    if (uVar3 < size) {
      if (0xfffffffffefffffe < size) {
        return (char *)0x0;
      }
      pSVar4 = (String *)malloc((size & 0xffffffffffffff80) + 0x80);
      if (pSVar4 == (String *)0x0) {
        return (char *)0x0;
      }
      if (SVar2 == (String)0x1f) {
        free(__ptr);
      }
      *this = (String)0x1f;
      *(size_t *)(this + 8) = size;
      *(size_t *)(this + 0x10) = size | 0x7f;
      *(String **)(this + 0x18) = pSVar4;
      __ptr = pSVar4;
    }
    else if ((byte)SVar2 < 0x1f) {
      *this = SUB81(size,0);
    }
    else {
      *(size_t *)(this + 8) = size;
    }
    __ptr[size] = (String)0x0;
    return (char *)__ptr;
  }
  size_00 = -__n - 0x1000002;
  if (size_00 <= size) {
    return (char *)0x0;
  }
  uVar1 = __n + size;
  if (uVar1 <= uVar3) {
    if ((byte)SVar2 < 0x1f) {
      *this = SUB81(uVar1,0);
    }
    else {
      *(ulong *)(this + 8) = uVar1;
    }
    __ptr[uVar1] = (String)0x0;
    return (char *)(__ptr + __n);
  }
  uVar3 = uVar1 + 1;
  if (0xfffffffffefffffe < uVar3) {
    prepare();
    goto LAB_0012b5c9;
  }
  uVar6 = size + 1;
  size_00 = 0x200;
  if (0x200 < uVar6) {
    size_00 = uVar6;
  }
  if (uVar6 < 0x80) {
    size_00 = 0x80;
  }
  if (size_00 < uVar3) {
    uVar5 = uVar1 >> 1 | uVar1;
    uVar5 = uVar5 >> 2 | uVar5;
    uVar5 = uVar5 >> 4 | uVar5;
    uVar5 = uVar5 >> 8 | uVar5;
    uVar5 = uVar5 >> 0x10 | uVar5;
    size_00 = (uVar5 >> 0x20 | uVar5) + 1;
    uVar6 = uVar3;
    if (uVar3 <= size_00) {
      if (0x1000000 < size_00) {
        size_00 = ((uint)uVar3 & 0xffffff) + uVar3;
      }
      goto LAB_0012b4ba;
    }
  }
  else {
LAB_0012b4ba:
    uVar6 = 0xfffffffffeffffff;
    if (size_00 < 0xfffffffffeffffff) {
      uVar6 = size_00;
    }
  }
  op = (ModifyOp)uVar5;
  if (uVar3 <= uVar6) {
    __dest = malloc(uVar6);
    if (__dest == (void *)0x0) {
      return (char *)0x0;
    }
    memcpy(__dest,__ptr,__n);
    if (SVar2 == (String)0x1f) {
      free(__ptr);
    }
    *this = (String)0x1f;
    *(ulong *)(this + 8) = uVar1;
    *(ulong *)(this + 0x10) = uVar6 - 1;
    *(void **)(this + 0x18) = __dest;
    *(undefined1 *)((long)__dest + uVar1) = 0;
    return (char *)((long)__dest + __n);
  }
LAB_0012b5c9:
  prepare();
  if (size_00 == 0xffffffffffffffff) {
    if (__s == (char *)0x0) {
      size_00 = 0;
    }
    else {
      size_00 = strlen(__s);
    }
  }
  pcVar7 = (char *)0x0;
  if (size_00 != 0) {
    __dest_00 = prepare(this,op,size_00);
    if (__dest_00 == (char *)0x0) {
      pcVar7 = (char *)0x1;
    }
    else {
      memcpy(__dest_00,__s,size_00);
    }
  }
  return pcVar7;
}

Assistant:

char* String::prepare(ModifyOp op, size_t size) noexcept {
  char* curData;
  size_t curSize;
  size_t curCapacity;

  if (isLargeOrExternal()) {
    curData = _large.data;
    curSize = _large.size;
    curCapacity = _large.capacity;
  }
  else {
    curData = _small.data;
    curSize = _small.type;
    curCapacity = kSSOCapacity;
  }

  if (op == ModifyOp::kAssign) {
    if (size > curCapacity) {
      // Prevent arithmetic overflow.
      if (ASMJIT_UNLIKELY(size >= kMaxAllocSize))
        return nullptr;

      size_t newCapacity = Support::alignUp<size_t>(size + 1, kMinAllocSize);
      char* newData = static_cast<char*>(::malloc(newCapacity));

      if (ASMJIT_UNLIKELY(!newData))
        return nullptr;

      if (_type == kTypeLarge)
        ::free(curData);

      _large.type = kTypeLarge;
      _large.size = size;
      _large.capacity = newCapacity - 1;
      _large.data = newData;

      newData[size] = '\0';
      return newData;
    }
    else {
      _setSize(size);
      curData[size] = '\0';
      return curData;
    }
  }
  else {
    // Prevent arithmetic overflow.
    if (ASMJIT_UNLIKELY(size >= kMaxAllocSize - curSize - 1))
      return nullptr;

    size_t newSize = size + curSize;
    size_t newSizePlusOne = newSize + 1;

    if (newSize > curCapacity) {
      size_t newCapacityPlusOne = String_growCapacity(size + 1u, newSizePlusOne);
      ASMJIT_ASSERT(newCapacityPlusOne >= newSizePlusOne);

      if (ASMJIT_UNLIKELY(newCapacityPlusOne < newSizePlusOne))
        return nullptr;

      char* newData = static_cast<char*>(::malloc(newCapacityPlusOne));
      if (ASMJIT_UNLIKELY(!newData))
        return nullptr;

      memcpy(newData, curData, curSize);

      if (_type == kTypeLarge)
        ::free(curData);

      _large.type = kTypeLarge;
      _large.size = newSize;
      _large.capacity = newCapacityPlusOne - 1;
      _large.data = newData;

      newData[newSize] = '\0';
      return newData + curSize;
    }
    else {
      _setSize(newSize);
      curData[newSize] = '\0';
      return curData + curSize;
    }
  }
}